

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,void *value)

{
  basic_format_specs<char> *specs;
  buffer_appender<char> bVar1;
  error_handler local_9;
  
  specs = this->specs_;
  if (((specs != (basic_format_specs<char> *)0x0) && (specs->type != '\0')) && (specs->type != 'p'))
  {
    error_handler::on_error(&local_9,"invalid type specifier");
  }
  bVar1 = write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                    ((buffer_appender<char>)
                     (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                     container,(unsigned_long)value,specs);
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return (iterator)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_) check_pointer_type_spec(specs_->type, error_handler());
    write_pointer(value);
    return out_;
  }